

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Function<kj::Promise<void>_(kj::StringPtr)> * __thiscall
kj::_::NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>::
emplace<kj::Function<kj::Promise<void>(kj::StringPtr)>>
          (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>> *this,
          Function<kj::Promise<void>_(kj::StringPtr)> *params)

{
  Function<kj::Promise<void>_(kj::StringPtr)> *params_00;
  Function<kj::Promise<void>_(kj::StringPtr)> *params_local;
  NullableValue<kj::Function<kj::Promise<void>_(kj::StringPtr)>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>)0x0;
    dtor<kj::Function<kj::Promise<void>(kj::StringPtr)>>
              ((Function<kj::Promise<void>_(kj::StringPtr)> *)(this + 8));
  }
  params_00 = fwd<kj::Function<kj::Promise<void>(kj::StringPtr)>>(params);
  ctor<kj::Function<kj::Promise<void>(kj::StringPtr)>,kj::Function<kj::Promise<void>(kj::StringPtr)>>
            ((Function<kj::Promise<void>_(kj::StringPtr)> *)(this + 8),params_00);
  *this = (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>)0x1;
  return (Function<kj::Promise<void>_(kj::StringPtr)> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }